

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kgc.cpp
# Opt level: O0

void __thiscall Kgc::markAll(Kgc *this)

{
  bool bVar1;
  reference pppVVar2;
  reference ppVVar3;
  Value *v_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<const_Value_*,_std::allocator<const_Value_*>_> *__range1_1;
  Value **v;
  iterator __end1;
  iterator __begin1;
  vector<const_Value_**,_std::allocator<const_Value_**>_> *__range1;
  Kgc *this_local;
  
  __end1 = std::vector<const_Value_**,_std::allocator<const_Value_**>_>::begin
                     (&this->localStackRoots_);
  v = (Value **)
      std::vector<const_Value_**,_std::allocator<const_Value_**>_>::end(&this->localStackRoots_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Value_***,_std::vector<const_Value_**,_std::allocator<const_Value_**>_>_>
                                *)&v);
    if (!bVar1) break;
    pppVVar2 = __gnu_cxx::
               __normal_iterator<const_Value_***,_std::vector<const_Value_**,_std::allocator<const_Value_**>_>_>
               ::operator*(&__end1);
    if (**pppVVar2 != (Value *)0x0) {
      mark(this,**pppVVar2);
    }
    __gnu_cxx::
    __normal_iterator<const_Value_***,_std::vector<const_Value_**,_std::allocator<const_Value_**>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<const_Value_*,_std::allocator<const_Value_*>_>::begin(&this->stackRoots_);
  v_1 = (Value *)std::vector<const_Value_*,_std::allocator<const_Value_*>_>::end(&this->stackRoots_)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_Value_**,_std::vector<const_Value_*,_std::allocator<const_Value_*>_>_>
                        *)&v_1);
    if (!bVar1) break;
    ppVVar3 = __gnu_cxx::
              __normal_iterator<const_Value_**,_std::vector<const_Value_*,_std::allocator<const_Value_*>_>_>
              ::operator*(&__end1_1);
    mark(this,*ppVVar3);
    __gnu_cxx::
    __normal_iterator<const_Value_**,_std::vector<const_Value_*,_std::allocator<const_Value_*>_>_>::
    operator++(&__end1_1);
  }
  return;
}

Assistant:

void Kgc::markAll()
{
    for (auto v : localStackRoots_)
    {
        if (*v)
        {
            mark(*v);
        }
    }
    
    for (auto v : stackRoots_)
    {
        mark(v);
    }
}